

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

void __thiscall jbcoin::STAmount::STAmount(STAmount *this,SerialIter *sit,SField *name)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined1 local_88 [3];
  bool isNegative;
  int offset;
  uint160 local_74;
  undefined1 local_60 [8];
  Issue issue;
  uint64_t value;
  SField *name_local;
  SerialIter *sit_local;
  STAmount *this_local;
  
  STBase::STBase(&this->super_STBase,name);
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STAmount_00519e68;
  Issue::Issue(&this->mIssue);
  issue.account.pn._12_8_ = SerialIter::get64(sit);
  if ((issue.account.pn._12_8_ & 0x8000000000000000) == 0) {
    if ((issue.account.pn._12_8_ & 0x4000000000000000) == 0) {
      if (issue.account.pn._12_8_ == 0) {
        Throw<std::runtime_error,char_const(&)[31]>((char (*) [31])"negative zero is not canonical")
        ;
      }
      this->mValue = issue.account.pn._12_8_;
      this->mOffset = 0;
      this->mIsNative = true;
      this->mIsNegative = true;
    }
    else {
      this->mValue = issue.account.pn._12_8_ & 0xbfffffffffffffff;
      this->mOffset = 0;
      this->mIsNative = true;
      this->mIsNegative = false;
    }
  }
  else {
    Issue::Issue((Issue *)local_60);
    SerialIter::get160(&local_74,sit);
    base_uint<160UL,_jbcoin::detail::CurrencyTag>::copyFrom<void>
              ((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)local_60,&local_74);
    bVar1 = isXRP((Currency *)local_60);
    if (bVar1) {
      Throw<std::runtime_error,char_const(&)[24]>((char (*) [24])"invalid native currency");
    }
    SerialIter::get160((uint160 *)local_88,sit);
    base_uint<160UL,_jbcoin::detail::AccountIDTag>::copyFrom<void>
              ((base_uint<160UL,_jbcoin::detail::AccountIDTag> *)(issue.currency.pn + 3),
               (base_uint<160UL,_void> *)local_88);
    bVar1 = isXRP((AccountID *)(issue.currency.pn + 3));
    if (bVar1) {
      Throw<std::runtime_error,char_const(&)[23]>((char (*) [23])"invalid native account");
    }
    uVar2 = issue.account.pn[4] >> 0x16;
    issue.account.pn._12_8_ = issue.account.pn._12_8_ & 0x3fffffffffffff;
    if (issue.account.pn._12_8_ == 0) {
      if (uVar2 != 0x200) {
        Throw<std::runtime_error,char_const(&)[23]>((char (*) [23])"invalid currency value");
      }
      Issue::operator=(&this->mIssue,(Issue *)local_60);
      this->mValue = 0;
      this->mOffset = 0;
      this->mIsNegative = false;
      canonicalize(this);
    }
    else {
      iVar3 = (uVar2 & 0xff) - 0x61;
      if (((((ulong)issue.account.pn._12_8_ < 1000000000000000) ||
           (9999999999999999 < (ulong)issue.account.pn._12_8_)) || (iVar3 < -0x60)) ||
         (0x50 < iVar3)) {
        Throw<std::runtime_error,char_const(&)[23]>((char (*) [23])"invalid currency value");
      }
      Issue::operator=(&this->mIssue,(Issue *)local_60);
      this->mValue = issue.account.pn._12_8_;
      this->mOffset = iVar3;
      this->mIsNegative = (uVar2 & 0x100) == 0;
      canonicalize(this);
    }
  }
  return;
}

Assistant:

STAmount::STAmount(SerialIter& sit, SField const& name)
    : STBase(name)
{
    std::uint64_t value = sit.get64 ();

    // native
    if ((value & cNotNative) == 0)
    {
        // positive
        if ((value & cPosNative) != 0)
        {
            mValue = value & ~cPosNative;
            mOffset = 0;
            mIsNative = true;
            mIsNegative = false;
            return;
        }

        // negative
        if (value == 0)
            Throw<std::runtime_error> ("negative zero is not canonical");

        mValue = value;
        mOffset = 0;
        mIsNative = true;
        mIsNegative = true;
        return;
    }

    Issue issue;
    issue.currency.copyFrom (sit.get160 ());

    if (isXRP (issue.currency))
        Throw<std::runtime_error> ("invalid native currency");

    issue.account.copyFrom (sit.get160 ());

    if (isXRP (issue.account))
        Throw<std::runtime_error> ("invalid native account");

    // 10 bits for the offset, sign and "not native" flag
    int offset = static_cast<int>(value >> (64 - 10));

    value &= ~ (1023ull << (64 - 10));

    if (value)
    {
        bool isNegative = (offset & 256) == 0;
        offset = (offset & 255) - 97; // center the range

        if (value < cMinValue ||
            value > cMaxValue ||
            offset < cMinOffset ||
            offset > cMaxOffset)
        {
            Throw<std::runtime_error> ("invalid currency value");
        }

        mIssue = issue;
        mValue = value;
        mOffset = offset;
        mIsNegative = isNegative;
        canonicalize();
        return;
    }

    if (offset != 512)
        Throw<std::runtime_error> ("invalid currency value");

    mIssue = issue;
    mValue = 0;
    mOffset = 0;
    mIsNegative = false;
    canonicalize();
}